

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

char * __thiscall
fmt::v7::detail::utf8_to_utf16::utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *p)

{
  uint uVar1;
  wchar_t wVar2;
  char *pcVar3;
  utf8_to_utf16 *puVar4;
  runtime_error *this_00;
  utf8_to_utf16 *puVar5;
  utf8_to_utf16 *puVar6;
  utf8_to_utf16 *puVar7;
  int local_30;
  wchar_t local_2c;
  int error;
  
  local_2c = L'\0';
  local_30 = 0;
  pcVar3 = utf8_decode(p,(uint32_t *)&local_2c,&local_30);
  wVar2 = local_2c;
  if (local_30 == 0) {
    if ((uint)local_2c < 0x10000) {
      puVar4 = this[2].this;
      puVar7 = (utf8_to_utf16 *)((long)&(puVar4->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      if (this[3].this < puVar7) {
        (*(code *)(this->this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
        puVar4 = this[2].this;
        puVar7 = (utf8_to_utf16 *)((long)&(puVar4->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      }
      this[2].this = puVar7;
      ((this[1].this)->buffer_).store_[(long)&puVar4[-1].buffer_.field_0x7f0] = wVar2;
    }
    else {
      uVar1 = local_2c + L'\xffff0000';
      puVar4 = this[2].this;
      puVar5 = this[3].this;
      puVar7 = (utf8_to_utf16 *)((long)&(puVar4->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      if (puVar5 < puVar7) {
        (*(code *)(this->this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
        puVar4 = this[2].this;
        puVar5 = this[3].this;
        puVar7 = (utf8_to_utf16 *)((long)&(puVar4->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      }
      puVar6 = this[1].this;
      this[2].this = puVar7;
      (puVar6->buffer_).store_[(long)&puVar4[-1].buffer_.field_0x7f0] = (uVar1 >> 10) + L'\xd800';
      puVar4 = (utf8_to_utf16 *)((long)&(puVar7->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      if (puVar5 < puVar4) {
        (*(code *)(this->this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this,puVar4);
        puVar6 = this[1].this;
        puVar7 = this[2].this;
        puVar4 = (utf8_to_utf16 *)((long)&(puVar7->buffer_).super_buffer<wchar_t>._vptr_buffer + 1);
      }
      this[2].this = puVar4;
      (puVar6->buffer_).store_[(long)&puVar7[-1].buffer_.field_0x7f0] = wVar2 & 0x3ffU | 0xdc00;
    }
    return pcVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid utf8");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}